

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O0

uint128 * __thiscall pstore::uint128::to_hex_string_abi_cxx11_(uint128 *this)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  uint128 *in_RSI;
  uint128 *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  out = std::back_inserter<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  to_hex<std::back_insert_iterator<std::__cxx11::string>>(in_RSI,out);
  return this;
}

Assistant:

std::string uint128::to_hex_string () const {
        std::string result;
        result.reserve (hex_string_length);
        this->to_hex (std::back_inserter (result));
        return result;
    }